

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::BufferStorage::ErrorsTest::verifyError
          (ErrorsTest *this,GLenum expected_error,GLchar *error_message,bool *out_test_result)

{
  ostringstream *this_00;
  int iVar1;
  GLenum value;
  undefined4 extraout_var;
  char *pcVar2;
  undefined1 local_1a8 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  value = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (value != expected_error) {
    *out_test_result = false;
    local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Got invalid error: ");
    pcVar2 = glu::getErrorName(value);
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,", expected: ");
    pcVar2 = glu::getErrorName(expected_error);
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00,". Message: ");
    std::operator<<((ostream *)this_00,error_message);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return;
}

Assistant:

void ErrorsTest::verifyError(glw::GLenum expected_error, const glw::GLchar* error_message, bool& out_test_result)
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	const GLenum error = gl.getError();

	if (error != expected_error)
	{
		out_test_result = false;

		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Got invalid error: " << glu::getErrorName(error)
			<< ", expected: " << glu::getErrorName(expected_error) << ". Message: " << error_message
			<< tcu::TestLog::EndMessage;
	}
}